

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O1

void ImGui::EndTable(void)

{
  ImVec2 *pIVar1;
  ImVec4 *pIVar2;
  ImVec2 IVar3;
  ImVec2 IVar4;
  undefined2 uVar5;
  ImGuiWindow *window;
  ImGuiWindow *pIVar6;
  ImDrawListSplitter *this;
  ImBitArrayPtr pIVar7;
  ImGuiTableColumn *pIVar8;
  ImGuiContext *pIVar9;
  bool bVar10;
  byte bVar11;
  int iVar12;
  ImGuiTableInstanceData *pIVar13;
  ImGuiTableTempData *pIVar14;
  ImGuiTable *pIVar15;
  long lVar16;
  ulong uVar17;
  uint uVar18;
  uint uVar19;
  float fVar20;
  float fVar21;
  uint extraout_XMM0_Db;
  uint uVar22;
  uint extraout_XMM0_Dc;
  uint uVar23;
  uint extraout_XMM0_Dd;
  uint uVar24;
  undefined1 auVar25 [16];
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  uint uVar30;
  uint uVar31;
  ImVec2 local_38;
  
  pIVar9 = GImGui;
  pIVar15 = GImGui->CurrentTable;
  if (pIVar15->IsLayoutLocked == false) {
    TableUpdateLayout(pIVar15);
  }
  uVar30 = pIVar15->Flags;
  window = pIVar15->InnerWindow;
  pIVar6 = pIVar15->OuterWindow;
  pIVar14 = pIVar15->TempData;
  if (pIVar15->IsInsideRow == true) {
    TableEndRow(pIVar15);
  }
  if (((((uVar30 & 0x20) != 0) && (pIVar15->HoveredColumnBody != -1)) &&
      (bVar10 = IsAnyItemHovered(), !bVar10)) && (bVar10 = IsMouseReleased(1), bVar10)) {
    TableOpenContextMenu((int)pIVar15->HoveredColumnBody);
  }
  if ((long)pIVar15->InstanceCurrent == 0) {
    pIVar13 = &pIVar15->InstanceDataFirst;
  }
  else {
    pIVar13 = (pIVar15->InstanceDataExtra).Data + (long)pIVar15->InstanceCurrent + -1;
  }
  (window->DC).PrevLineSize = pIVar14->HostBackupPrevLineSize;
  (window->DC).CurrLineSize = pIVar14->HostBackupCurrLineSize;
  (window->DC).CursorMaxPos = pIVar14->HostBackupCursorMaxPos;
  fVar28 = pIVar15->RowPosY2;
  if (window == pIVar6) {
    if ((uVar30 >> 0x11 & 1) == 0) {
      fVar29 = (pIVar15->OuterRect).Max.y;
      uVar18 = -(uint)(fVar28 <= fVar29);
      fVar29 = (float)(~uVar18 & (uint)fVar28 | (uint)fVar29 & uVar18);
      (pIVar15->InnerRect).Max.y = fVar29;
      (pIVar15->OuterRect).Max.y = fVar29;
    }
  }
  else {
    (window->DC).CursorMaxPos.y = fVar28;
  }
  fVar29 = (pIVar15->OuterRect).Max.y;
  fVar26 = (pIVar15->WorkRect).Max.y;
  uVar18 = -(uint)(fVar29 <= fVar26);
  (pIVar15->WorkRect).Max.y = (float)(~uVar18 & (uint)fVar29 | (uint)fVar26 & uVar18);
  pIVar13->LastOuterHeight = fVar29 - (pIVar15->OuterRect).Min.y;
  if (((uint)pIVar15->Flags >> 0x18 & 1) != 0) {
    fVar29 = (pIVar15->InnerWindow->DC).CursorMaxPos.x;
    if ((long)pIVar15->RightMostEnabledColumn != -1) {
      fVar26 = 0.0;
      if (((uint)pIVar15->Flags >> 10 & 1) != 0) {
        fVar26 = 1.0;
      }
      fVar26 = ((pIVar15->Columns).Data[pIVar15->RightMostEnabledColumn].WorkMaxX +
                pIVar15->CellPaddingX + pIVar15->OuterPaddingX) - fVar26;
      uVar18 = -(uint)(fVar26 <= fVar29);
      fVar29 = (float)(uVar18 & (uint)fVar29 | ~uVar18 & (uint)fVar26);
    }
    if (pIVar15->ResizedColumn != -1) {
      uVar18 = -(uint)(pIVar15->ResizeLockMinContentsX2 <= fVar29);
      fVar29 = (float)((uint)fVar29 & uVar18 | ~uVar18 & (uint)pIVar15->ResizeLockMinContentsX2);
    }
    (pIVar15->InnerWindow->DC).CursorMaxPos.x = fVar29 + pIVar15->TempData->AngledHeadersExtraWidth;
  }
  if ((uVar30 >> 0x14 & 1) == 0) {
    ImDrawList::PopClipRect(window->DrawList);
  }
  pIVar2 = (window->DrawList->_ClipRectStack).Data +
           (long)(window->DrawList->_ClipRectStack).Size + -1;
  fVar29 = pIVar2->y;
  fVar26 = pIVar2->z;
  fVar27 = pIVar2->w;
  (window->ClipRect).Min.x = pIVar2->x;
  (window->ClipRect).Min.y = fVar29;
  (window->ClipRect).Max.x = fVar26;
  (window->ClipRect).Max.y = fVar27;
  if ((uVar30 & 0x780) != 0) {
    TableDrawBorders(pIVar15);
  }
  this = pIVar15->DrawSplitter;
  ImDrawListSplitter::SetCurrentChannel(this,window->DrawList,0);
  if ((pIVar15->Flags & 0x100000) == 0) {
    TableMergeDrawChannels(pIVar15);
  }
  ImDrawListSplitter::Merge(this,window->DrawList);
  iVar12 = pIVar15->ColumnsCount;
  if ((long)iVar12 < 1) {
    fVar29 = 0.0;
    fVar26 = 0.0;
    fVar27 = 0.0;
  }
  else {
    pIVar7 = pIVar15->EnabledMaskByIndex;
    fVar27 = 0.0;
    lVar16 = 0x18;
    uVar17 = 0;
    fVar26 = 0.0;
    fVar29 = 0.0;
    uVar30 = 0;
    uVar18 = 0;
    uVar31 = 0;
    do {
      if ((pIVar7[uVar17 >> 5 & 0x7ffffff] >> ((uint)uVar17 & 0x1f) & 1) != 0) {
        pIVar8 = (pIVar15->Columns).Data;
        uVar19 = *(uint *)((long)pIVar8 + lVar16 + -0x18);
        if ((uVar19 & 0x30) == 0x10) {
          fVar20 = *(float *)((long)pIVar8 + lVar16 + -8);
          uVar22 = 0;
          uVar23 = 0;
          uVar24 = 0;
        }
        else {
          fVar20 = TableGetColumnWidthAuto
                             (pIVar15,(ImGuiTableColumn *)((long)pIVar8 + lVar16 + -0x18));
          uVar22 = extraout_XMM0_Db;
          uVar23 = extraout_XMM0_Dc;
          uVar24 = extraout_XMM0_Dd;
        }
        if ((uVar19 & 0x10) == 0) {
          fVar26 = fVar26 + fVar20;
        }
        else {
          fVar27 = fVar27 + fVar20;
        }
        if ((~uVar19 & 0x28) == 0) {
          fVar20 = fVar20 / (*(float *)((long)&pIVar8->Flags + lVar16) /
                            pIVar15->ColumnsStretchSumWeights);
          uVar19 = -(uint)(fVar20 <= fVar29);
          auVar25._0_4_ = uVar19 & (uint)fVar29;
          auVar25._4_4_ = uVar22 & uVar30;
          auVar25._8_4_ = uVar23 & uVar18;
          auVar25._12_4_ = uVar24 & uVar31;
          auVar25 = auVar25 | ZEXT416(~uVar19 & (uint)fVar20);
          fVar29 = auVar25._0_4_;
          uVar30 = auVar25._4_4_;
          uVar18 = auVar25._8_4_;
          uVar31 = auVar25._12_4_;
        }
      }
      uVar17 = uVar17 + 1;
      lVar16 = lVar16 + 0x70;
    } while ((long)iVar12 != uVar17);
  }
  fVar20 = pIVar15->CellPaddingX + pIVar15->CellPaddingX;
  pIVar15->ColumnsAutoFitWidth =
       (float)(~-(uint)(fVar29 <= fVar26) & (uint)fVar29 | (uint)fVar26 & -(uint)(fVar29 <= fVar26))
       + (float)(int)pIVar15->ColumnsEnabledCount * fVar20 +
         pIVar15->OuterPaddingX + pIVar15->OuterPaddingX +
         (float)(pIVar15->ColumnsEnabledCount + -1) *
         (pIVar15->CellSpacingX1 + pIVar15->CellSpacingX2) + fVar27;
  if ((window == pIVar6) || ((pIVar15->Flags & 0x1000000U) != 0)) {
    if ((((long)pIVar15->LastResizedColumn != -1) &&
        ((pIVar15->ResizedColumn == -1 && (window->ScrollbarX == true)))) &&
       (pIVar15->InstanceInteracted == pIVar15->InstanceCurrent)) {
      fVar20 = fVar20 + pIVar15->MinColumnWidth;
      fVar29 = (pIVar15->Columns).Data[pIVar15->LastResizedColumn].MaxX;
      if ((pIVar15->InnerClipRect).Min.x <= fVar29) {
        pIVar1 = &(pIVar15->InnerClipRect).Max;
        if (fVar29 < pIVar1->x || fVar29 == pIVar1->x) goto LAB_001b2bac;
        fVar20 = fVar20 + (fVar29 - (window->Pos).x);
      }
      else {
        fVar20 = (fVar29 - (window->Pos).x) - fVar20;
      }
      SetScrollFromPosX(window,fVar20,1.0);
    }
  }
  else {
    (window->Scroll).x = 0.0;
  }
LAB_001b2bac:
  if (((long)pIVar15->ResizedColumn != -1) &&
     (pIVar15->InstanceCurrent == pIVar15->InstanceInteracted)) {
    pIVar15->ResizedColumnNextWidth =
         (float)(int)(((((float)(int)(pIVar9->CurrentDpiScale * 4.0) +
                        ((pIVar9->IO).MousePos.x - (pIVar9->ActiveIdClickOffset).x)) -
                       (pIVar15->Columns).Data[pIVar15->ResizedColumn].MinX) -
                      pIVar15->CellSpacingX1) - (pIVar15->CellPaddingX + pIVar15->CellPaddingX));
  }
  if (pIVar9->ActiveIdIsAlive == 0) {
    bVar11 = false;
  }
  else {
    bVar11 = pIVar15->IsActiveIdAliveBeforeTable ^ 1;
  }
  pIVar15->IsActiveIdInTable = (bool)bVar11;
  if (0 < pIVar15->InstanceCurrent) {
    PopID();
  }
  PopID();
  fVar29 = (pIVar6->DC).CursorMaxPos.x;
  fVar26 = (pIVar6->DC).CursorMaxPos.y;
  IVar3 = (pIVar14->HostBackupWorkRect).Max;
  (window->WorkRect).Min = (pIVar14->HostBackupWorkRect).Min;
  (window->WorkRect).Max = IVar3;
  IVar3 = (pIVar14->HostBackupParentWorkRect).Max;
  (window->ParentWorkRect).Min = (pIVar14->HostBackupParentWorkRect).Min;
  (window->ParentWorkRect).Max = IVar3;
  window->SkipItems = pIVar15->HostSkipItems;
  (pIVar6->DC).CursorPos = (pIVar15->OuterRect).Min;
  (pIVar6->DC).ItemWidth = pIVar14->HostBackupItemWidth;
  (pIVar6->DC).ItemWidthStack.Size = pIVar14->HostBackupItemWidthStackSize;
  (pIVar6->DC).ColumnsOffset.x = (pIVar14->HostBackupColumnsOffset).x;
  if (window == pIVar6) {
    IVar3 = (pIVar15->OuterRect).Min;
    IVar4 = (pIVar15->OuterRect).Max;
    local_38.x = IVar4.x - IVar3.x;
    local_38.y = IVar4.y - IVar3.y;
    ItemSize(&local_38,-1.0);
    ItemAdd(&pIVar15->OuterRect,0,(ImRect *)0x0,0);
  }
  else {
    uVar5 = (window->DC).NavLayersActiveMask;
    (window->DC).NavLayersActiveMask = uVar5 | 1;
    EndChild();
    (window->DC).NavLayersActiveMask = uVar5;
  }
  uVar30 = pIVar15->Flags;
  if ((uVar30 >> 0x10 & 1) == 0) {
    fVar27 = (pIVar14->UserOuterSize).x;
    fVar20 = 0.0;
    if (fVar27 <= 0.0) {
      if ((uVar30 >> 0x19 & 1) != 0) {
        fVar20 = (window->ScrollbarSizes).x;
      }
      fVar21 = (pIVar15->OuterRect).Min.x + pIVar15->ColumnsAutoFitWidth +
               pIVar15->TempData->AngledHeadersExtraWidth + fVar20;
      fVar20 = (pIVar6->DC).IdealMaxPos.x;
      fVar27 = fVar21 - fVar27;
      uVar18 = -(uint)(fVar27 <= fVar20);
      (pIVar6->DC).IdealMaxPos.x = (float)(uVar18 & (uint)fVar20 | ~uVar18 & (uint)fVar27);
      fVar27 = (pIVar15->OuterRect).Max.x;
      if (fVar21 <= fVar27) {
        fVar27 = fVar21;
      }
    }
    else {
      fVar27 = (pIVar15->OuterRect).Max.x;
    }
  }
  else {
    fVar27 = (pIVar15->OuterRect).Min.x + pIVar15->ColumnsAutoFitWidth;
  }
  uVar18 = -(uint)(fVar27 <= fVar29);
  (pIVar6->DC).CursorMaxPos.x = (float)(~uVar18 & (uint)fVar27 | (uint)fVar29 & uVar18);
  fVar29 = (pIVar14->UserOuterSize).y;
  fVar27 = 0.0;
  if (fVar29 <= 0.0) {
    if ((uVar30 >> 0x18 & 1) != 0) {
      fVar27 = (window->ScrollbarSizes).y;
    }
    fVar20 = (pIVar6->DC).IdealMaxPos.y;
    fVar28 = fVar28 + fVar27;
    fVar29 = fVar28 - fVar29;
    uVar30 = -(uint)(fVar29 <= fVar20);
    (pIVar6->DC).IdealMaxPos.y = (float)(uVar30 & (uint)fVar20 | ~uVar30 & (uint)fVar29);
    fVar29 = (pIVar15->OuterRect).Max.y;
    if (fVar28 <= fVar29) {
      fVar29 = fVar28;
    }
  }
  else {
    fVar29 = (pIVar15->OuterRect).Max.y;
  }
  uVar30 = -(uint)(fVar29 <= fVar26);
  (pIVar6->DC).CursorMaxPos.y = (float)(~uVar30 & (uint)fVar29 | (uint)fVar26 & uVar30);
  if (pIVar15->IsSettingsDirty == true) {
    TableSaveSettings(pIVar15);
  }
  pIVar15->IsInitializing = false;
  iVar12 = pIVar9->TablesTempDataStacked;
  pIVar9->TablesTempDataStacked = iVar12 + -1;
  if ((long)iVar12 < 2) {
    pIVar14 = (ImGuiTableTempData *)0x0;
  }
  else {
    pIVar14 = (pIVar9->TablesTempData).Data + (long)iVar12 + -2;
  }
  if (pIVar14 == (ImGuiTableTempData *)0x0) {
    pIVar15 = (ImGuiTable *)0x0;
  }
  else {
    pIVar15 = (pIVar9->Tables).Buf.Data + pIVar14->TableIndex;
  }
  pIVar9->CurrentTable = pIVar15;
  if (pIVar15 == (ImGuiTable *)0x0) {
    iVar12 = -1;
  }
  else {
    pIVar15->TempData = pIVar14;
    pIVar15->DrawSplitter = &pIVar14->DrawSplitter;
    iVar12 = (int)((ulong)((long)pIVar15 - (long)(pIVar9->Tables).Buf.Data) >> 4) * -0x6eb3e453;
  }
  (pIVar6->DC).CurrentTableIdx = iVar12;
  NavUpdateCurrentWindowIsScrollPushableX();
  return;
}

Assistant:

void    ImGui::EndTable()
{
    ImGuiContext& g = *GImGui;
    ImGuiTable* table = g.CurrentTable;
    IM_ASSERT(table != NULL && "Only call EndTable() if BeginTable() returns true!");

    // This assert would be very useful to catch a common error... unfortunately it would probably trigger in some
    // cases, and for consistency user may sometimes output empty tables (and still benefit from e.g. outer border)
    //IM_ASSERT(table->IsLayoutLocked && "Table unused: never called TableNextRow(), is that the intent?");

    // If the user never got to call TableNextRow() or TableNextColumn(), we call layout ourselves to ensure all our
    // code paths are consistent (instead of just hoping that TableBegin/TableEnd will work), get borders drawn, etc.
    if (!table->IsLayoutLocked)
        TableUpdateLayout(table);

    const ImGuiTableFlags flags = table->Flags;
    ImGuiWindow* inner_window = table->InnerWindow;
    ImGuiWindow* outer_window = table->OuterWindow;
    ImGuiTableTempData* temp_data = table->TempData;
    IM_ASSERT(inner_window == g.CurrentWindow);
    IM_ASSERT(outer_window == inner_window || outer_window == inner_window->ParentWindow);

    if (table->IsInsideRow)
        TableEndRow(table);

    // Context menu in columns body
    if (flags & ImGuiTableFlags_ContextMenuInBody)
        if (table->HoveredColumnBody != -1 && !IsAnyItemHovered() && IsMouseReleased(ImGuiMouseButton_Right))
            TableOpenContextMenu((int)table->HoveredColumnBody);

    // Finalize table height
    ImGuiTableInstanceData* table_instance = TableGetInstanceData(table, table->InstanceCurrent);
    inner_window->DC.PrevLineSize = temp_data->HostBackupPrevLineSize;
    inner_window->DC.CurrLineSize = temp_data->HostBackupCurrLineSize;
    inner_window->DC.CursorMaxPos = temp_data->HostBackupCursorMaxPos;
    const float inner_content_max_y = table->RowPosY2;
    IM_ASSERT(table->RowPosY2 == inner_window->DC.CursorPos.y);
    if (inner_window != outer_window)
        inner_window->DC.CursorMaxPos.y = inner_content_max_y;
    else if (!(flags & ImGuiTableFlags_NoHostExtendY))
        table->OuterRect.Max.y = table->InnerRect.Max.y = ImMax(table->OuterRect.Max.y, inner_content_max_y); // Patch OuterRect/InnerRect height
    table->WorkRect.Max.y = ImMax(table->WorkRect.Max.y, table->OuterRect.Max.y);
    table_instance->LastOuterHeight = table->OuterRect.GetHeight();

    // Setup inner scrolling range
    // FIXME: This ideally should be done earlier, in BeginTable() SetNextWindowContentSize call, just like writing to inner_window->DC.CursorMaxPos.y,
    // but since the later is likely to be impossible to do we'd rather update both axises together.
    if (table->Flags & ImGuiTableFlags_ScrollX)
    {
        const float outer_padding_for_border = (table->Flags & ImGuiTableFlags_BordersOuterV) ? TABLE_BORDER_SIZE : 0.0f;
        float max_pos_x = table->InnerWindow->DC.CursorMaxPos.x;
        if (table->RightMostEnabledColumn != -1)
            max_pos_x = ImMax(max_pos_x, table->Columns[table->RightMostEnabledColumn].WorkMaxX + table->CellPaddingX + table->OuterPaddingX - outer_padding_for_border);
        if (table->ResizedColumn != -1)
            max_pos_x = ImMax(max_pos_x, table->ResizeLockMinContentsX2);
        table->InnerWindow->DC.CursorMaxPos.x = max_pos_x + table->TempData->AngledHeadersExtraWidth;
    }

    // Pop clipping rect
    if (!(flags & ImGuiTableFlags_NoClip))
        inner_window->DrawList->PopClipRect();
    inner_window->ClipRect = inner_window->DrawList->_ClipRectStack.back();

    // Draw borders
    if ((flags & ImGuiTableFlags_Borders) != 0)
        TableDrawBorders(table);

#if 0
    // Strip out dummy channel draw calls
    // We have no way to prevent user submitting direct ImDrawList calls into a hidden column (but ImGui:: calls will be clipped out)
    // Pros: remove draw calls which will have no effect. since they'll have zero-size cliprect they may be early out anyway.
    // Cons: making it harder for users watching metrics/debugger to spot the wasted vertices.
    if (table->DummyDrawChannel != (ImGuiTableColumnIdx)-1)
    {
        ImDrawChannel* dummy_channel = &table->DrawSplitter._Channels[table->DummyDrawChannel];
        dummy_channel->_CmdBuffer.resize(0);
        dummy_channel->_IdxBuffer.resize(0);
    }
#endif

    // Flatten channels and merge draw calls
    ImDrawListSplitter* splitter = table->DrawSplitter;
    splitter->SetCurrentChannel(inner_window->DrawList, 0);
    if ((table->Flags & ImGuiTableFlags_NoClip) == 0)
        TableMergeDrawChannels(table);
    splitter->Merge(inner_window->DrawList);

    // Update ColumnsAutoFitWidth to get us ahead for host using our size to auto-resize without waiting for next BeginTable()
    float auto_fit_width_for_fixed = 0.0f;
    float auto_fit_width_for_stretched = 0.0f;
    float auto_fit_width_for_stretched_min = 0.0f;
    for (int column_n = 0; column_n < table->ColumnsCount; column_n++)
        if (IM_BITARRAY_TESTBIT(table->EnabledMaskByIndex, column_n))
        {
            ImGuiTableColumn* column = &table->Columns[column_n];
            float column_width_request = ((column->Flags & ImGuiTableColumnFlags_WidthFixed) && !(column->Flags & ImGuiTableColumnFlags_NoResize)) ? column->WidthRequest : TableGetColumnWidthAuto(table, column);
            if (column->Flags & ImGuiTableColumnFlags_WidthFixed)
                auto_fit_width_for_fixed += column_width_request;
            else
                auto_fit_width_for_stretched += column_width_request;
            if ((column->Flags & ImGuiTableColumnFlags_WidthStretch) && (column->Flags & ImGuiTableColumnFlags_NoResize) != 0)
                auto_fit_width_for_stretched_min = ImMax(auto_fit_width_for_stretched_min, column_width_request / (column->StretchWeight / table->ColumnsStretchSumWeights));
        }
    const float width_spacings = (table->OuterPaddingX * 2.0f) + (table->CellSpacingX1 + table->CellSpacingX2) * (table->ColumnsEnabledCount - 1);
    table->ColumnsAutoFitWidth = width_spacings + (table->CellPaddingX * 2.0f) * table->ColumnsEnabledCount + auto_fit_width_for_fixed + ImMax(auto_fit_width_for_stretched, auto_fit_width_for_stretched_min);

    // Update scroll
    if ((table->Flags & ImGuiTableFlags_ScrollX) == 0 && inner_window != outer_window)
    {
        inner_window->Scroll.x = 0.0f;
    }
    else if (table->LastResizedColumn != -1 && table->ResizedColumn == -1 && inner_window->ScrollbarX && table->InstanceInteracted == table->InstanceCurrent)
    {
        // When releasing a column being resized, scroll to keep the resulting column in sight
        const float neighbor_width_to_keep_visible = table->MinColumnWidth + table->CellPaddingX * 2.0f;
        ImGuiTableColumn* column = &table->Columns[table->LastResizedColumn];
        if (column->MaxX < table->InnerClipRect.Min.x)
            SetScrollFromPosX(inner_window, column->MaxX - inner_window->Pos.x - neighbor_width_to_keep_visible, 1.0f);
        else if (column->MaxX > table->InnerClipRect.Max.x)
            SetScrollFromPosX(inner_window, column->MaxX - inner_window->Pos.x + neighbor_width_to_keep_visible, 1.0f);
    }

    // Apply resizing/dragging at the end of the frame
    if (table->ResizedColumn != -1 && table->InstanceCurrent == table->InstanceInteracted)
    {
        ImGuiTableColumn* column = &table->Columns[table->ResizedColumn];
        const float new_x2 = (g.IO.MousePos.x - g.ActiveIdClickOffset.x + ImTrunc(TABLE_RESIZE_SEPARATOR_HALF_THICKNESS * g.CurrentDpiScale));
        const float new_width = ImTrunc(new_x2 - column->MinX - table->CellSpacingX1 - table->CellPaddingX * 2.0f);
        table->ResizedColumnNextWidth = new_width;
    }

    table->IsActiveIdInTable = (g.ActiveIdIsAlive != 0 && table->IsActiveIdAliveBeforeTable == false);

    // Pop from id stack
    IM_ASSERT_USER_ERROR(inner_window->IDStack.back() == table_instance->TableInstanceID, "Mismatching PushID/PopID!");
    IM_ASSERT_USER_ERROR(outer_window->DC.ItemWidthStack.Size >= temp_data->HostBackupItemWidthStackSize, "Too many PopItemWidth!");
    if (table->InstanceCurrent > 0)
        PopID();
    PopID();

    // Restore window data that we modified
    const ImVec2 backup_outer_max_pos = outer_window->DC.CursorMaxPos;
    inner_window->WorkRect = temp_data->HostBackupWorkRect;
    inner_window->ParentWorkRect = temp_data->HostBackupParentWorkRect;
    inner_window->SkipItems = table->HostSkipItems;
    outer_window->DC.CursorPos = table->OuterRect.Min;
    outer_window->DC.ItemWidth = temp_data->HostBackupItemWidth;
    outer_window->DC.ItemWidthStack.Size = temp_data->HostBackupItemWidthStackSize;
    outer_window->DC.ColumnsOffset = temp_data->HostBackupColumnsOffset;

    // Layout in outer window
    // (FIXME: To allow auto-fit and allow desirable effect of SameLine() we dissociate 'used' vs 'ideal' size by overriding
    // CursorPosPrevLine and CursorMaxPos manually. That should be a more general layout feature, see same problem e.g. #3414)
    if (inner_window != outer_window)
    {
        short backup_nav_layers_active_mask = inner_window->DC.NavLayersActiveMask;
        inner_window->DC.NavLayersActiveMask |= 1 << ImGuiNavLayer_Main; // So empty table don't appear to navigate differently.
        EndChild();
        inner_window->DC.NavLayersActiveMask = backup_nav_layers_active_mask;
    }
    else
    {
        ItemSize(table->OuterRect.GetSize());
        ItemAdd(table->OuterRect, 0);
    }

    // Override declared contents width/height to enable auto-resize while not needlessly adding a scrollbar
    if (table->Flags & ImGuiTableFlags_NoHostExtendX)
    {
        // FIXME-TABLE: Could we remove this section?
        // ColumnsAutoFitWidth may be one frame ahead here since for Fixed+NoResize is calculated from latest contents
        IM_ASSERT((table->Flags & ImGuiTableFlags_ScrollX) == 0);
        outer_window->DC.CursorMaxPos.x = ImMax(backup_outer_max_pos.x, table->OuterRect.Min.x + table->ColumnsAutoFitWidth);
    }
    else if (temp_data->UserOuterSize.x <= 0.0f)
    {
        // Some references for this: #7651 + tests "table_reported_size", "table_reported_size_outer" equivalent Y block
        // - Checking for ImGuiTableFlags_ScrollX/ScrollY flag makes us a frame ahead when disabling those flags.
        // - FIXME-TABLE: Would make sense to pre-compute expected scrollbar visibility/sizes to generally save a frame of feedback.
        const float inner_content_max_x = table->OuterRect.Min.x + table->ColumnsAutoFitWidth; // Slightly misleading name but used for code symmetry with inner_content_max_y
        const float decoration_size = table->TempData->AngledHeadersExtraWidth + ((table->Flags & ImGuiTableFlags_ScrollY) ? inner_window->ScrollbarSizes.x : 0.0f);
        outer_window->DC.IdealMaxPos.x = ImMax(outer_window->DC.IdealMaxPos.x, inner_content_max_x + decoration_size - temp_data->UserOuterSize.x);
        outer_window->DC.CursorMaxPos.x = ImMax(backup_outer_max_pos.x, ImMin(table->OuterRect.Max.x, inner_content_max_x + decoration_size));
    }
    else
    {
        outer_window->DC.CursorMaxPos.x = ImMax(backup_outer_max_pos.x, table->OuterRect.Max.x);
    }
    if (temp_data->UserOuterSize.y <= 0.0f)
    {
        const float decoration_size = (table->Flags & ImGuiTableFlags_ScrollX) ? inner_window->ScrollbarSizes.y : 0.0f;
        outer_window->DC.IdealMaxPos.y = ImMax(outer_window->DC.IdealMaxPos.y, inner_content_max_y + decoration_size - temp_data->UserOuterSize.y);
        outer_window->DC.CursorMaxPos.y = ImMax(backup_outer_max_pos.y, ImMin(table->OuterRect.Max.y, inner_content_max_y + decoration_size));
    }
    else
    {
        // OuterRect.Max.y may already have been pushed downward from the initial value (unless ImGuiTableFlags_NoHostExtendY is set)
        outer_window->DC.CursorMaxPos.y = ImMax(backup_outer_max_pos.y, table->OuterRect.Max.y);
    }

    // Save settings
    if (table->IsSettingsDirty)
        TableSaveSettings(table);
    table->IsInitializing = false;

    // Clear or restore current table, if any
    IM_ASSERT(g.CurrentWindow == outer_window && g.CurrentTable == table);
    IM_ASSERT(g.TablesTempDataStacked > 0);
    temp_data = (--g.TablesTempDataStacked > 0) ? &g.TablesTempData[g.TablesTempDataStacked - 1] : NULL;
    g.CurrentTable = temp_data ? g.Tables.GetByIndex(temp_data->TableIndex) : NULL;
    if (g.CurrentTable)
    {
        g.CurrentTable->TempData = temp_data;
        g.CurrentTable->DrawSplitter = &temp_data->DrawSplitter;
    }
    outer_window->DC.CurrentTableIdx = g.CurrentTable ? g.Tables.GetIndex(g.CurrentTable) : -1;
    NavUpdateCurrentWindowIsScrollPushableX();
}